

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void __thiscall
clunk::HashEntry::Set
          (HashEntry *this,uint64_t entryKey,Move *bestmove,int eval,int ply,int draft,
          int primaryFlag,int otherFlags)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  bool local_39;
  int draft_local;
  int ply_local;
  int eval_local;
  Move *bestmove_local;
  uint64_t entryKey_local;
  HashEntry *this_local;
  
  if (entryKey == 0) {
    __assert_fail("entryKey",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x5e,
                  "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                 );
  }
  bVar2 = Move::IsValid(bestmove);
  if (!bVar2) {
    __assert_fail("bestmove.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x5f,
                  "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                 );
  }
  iVar3 = eval;
  if (eval < 1) {
    iVar3 = -eval;
  }
  if (31999 < iVar3) {
    __assert_fail("abs(eval) < Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x60,
                  "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                 );
  }
  if (99 < (uint)ply) {
    __assert_fail("(ply >= 0) & (ply < MaxPlies)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x61,
                  "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                 );
  }
  local_39 = 0xff < (uint)draft;
  if (local_39) {
    __assert_fail("(draft >= 0) && (draft < 256)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x62,
                  "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                 );
  }
  bVar2 = true;
  if ((primaryFlag != 5) && (bVar2 = true, primaryFlag != 3)) {
    bVar2 = primaryFlag == 4;
  }
  if (!bVar2) {
    __assert_fail("(primaryFlag == HashEntry::LowerBound) || (primaryFlag == HashEntry::UpperBound) || (primaryFlag == HashEntry::ExactScore)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x65,
                  "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                 );
  }
  if ((otherFlags & 0xffffffe7U) != 0) {
    __assert_fail("!(otherFlags & ~HashEntry::OtherMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x66,
                  "void clunk::HashEntry::Set(const uint64_t, const Move &, const int, const int, const int, const int, const int)"
                 );
  }
  this->key = entryKey;
  uVar4 = Move::Bits(bestmove);
  this->moveBits = uVar4;
  this->depth = (uint8_t)draft;
  this->flags = (byte)primaryFlag | (byte)otherFlags;
  sVar1 = (short)eval;
  if (eval < 0x7919) {
    if (eval < -31000) {
      this->score = sVar1 - (short)ply;
    }
    else {
      this->score = sVar1;
    }
  }
  else {
    this->score = sVar1 + (short)ply;
  }
  return;
}

Assistant:

void Set(const uint64_t entryKey,
           const Move& bestmove,
           const int eval,
           const int ply,
           const int draft,
           const int primaryFlag,
           const int otherFlags)
  {
    assert(entryKey);
    assert(bestmove.IsValid());
    assert(abs(eval) < Infinity);
    assert((ply >= 0) & (ply < MaxPlies));
    assert((draft >= 0) && (draft < 256));
    assert((primaryFlag == HashEntry::LowerBound) ||
           (primaryFlag == HashEntry::UpperBound) ||
           (primaryFlag == HashEntry::ExactScore));
    assert(!(otherFlags & ~HashEntry::OtherMask));

    key      = entryKey;
    moveBits = bestmove.Bits();
    depth    = static_cast<uint8_t>(draft);
    flags    = static_cast<uint8_t>(primaryFlag | otherFlags);

    // store mate-in-N scores relative to position
    if (eval > MateScore) {
      score  = static_cast<int16_t>(eval + ply);
    }
    else if (eval < -MateScore) {
      score  = static_cast<int16_t>(eval - ply);
    }
    else {
      score  = static_cast<int16_t>(eval);
    }
  }